

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-private.h
# Opt level: O2

void __thiscall
Dashel::MemoryPacketStream::MemoryPacketStream
          (MemoryPacketStream *this,void **vtt,string *protocolName)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_PacketStream)._vptr_PacketStream = pp_Var1;
  *(void **)((long)&(this->super_PacketStream)._vptr_PacketStream + (long)pp_Var1[-3]) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_PacketStream)._vptr_PacketStream = pp_Var1;
  *(void **)((long)&(this->super_PacketStream)._vptr_PacketStream + (long)pp_Var1[-3]) = vtt[3];
  ExpandableBuffer::ExpandableBuffer((ExpandableBuffer *)&(this->super_PacketStream).field_0x8,0);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_Deque_base
            ((_Deque_base<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->super_PacketStream).field_0x20);
  return;
}

Assistant:

explicit MemoryPacketStream(const std::string& protocolName) :
			Stream(protocolName),
			PacketStream(protocolName) {}